

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLine.cpp
# Opt level: O0

void __thiscall ProxyLine::onRead(ProxyLine *this)

{
  int iVar1;
  ulong uVar2;
  time_t tVar3;
  usize uVar4;
  char *pcVar5;
  char *pcVar6;
  usize uVar7;
  Client *this_00;
  ICallback *pIVar8;
  String *this_01;
  String SStack_400f8;
  String SStack_400d0;
  char *pcStack_400a8;
  char *firstLineEnd;
  void *pvStack_40078;
  usize remainingSize;
  char *bufferPos;
  String SStack_40058;
  char *pcStack_40030;
  char *headerEnd;
  usize postponed;
  usize size;
  byte buffer [262145];
  ProxyLine *this_local;
  
  uVar2 = Server::Client::read(this->_handle,(int)&size,(void *)0x40000,(size_t)&postponed);
  if ((uVar2 & 1) != 0) {
    if ((this->_connected & 1U) == 0) {
      buffer[postponed - 8] = '\0';
      String::append(&this->_proxyResponse,(char *)&size,postponed);
      pcStack_40030 = String::find(&this->_proxyResponse,"\r\n\r\n");
      if (pcStack_40030 == (char *)0x0) {
        uVar7 = String::length(&this->_proxyResponse);
        if (0x100 < uVar7) {
          pIVar8 = this->_callback;
          String::String<21ul>(&SStack_400f8,(char (*) [21])"Invalid HTTP reponse");
          (*pIVar8->_vptr_ICallback[1])(pIVar8,this,&SStack_400f8);
          String::~String(&SStack_400f8);
        }
      }
      else {
        String::String<14ul>(&SStack_40058,(char (*) [14])"HTTP/1.1 200 ");
        iVar1 = String::compare(&this->_proxyResponse,&SStack_40058,0xd);
        String::~String(&SStack_40058);
        if (iVar1 == 0) {
          remainingSize = (usize)(pcStack_40030 + 4);
          uVar4 = String::length(&this->_proxyResponse);
          uVar7 = remainingSize;
          pcVar5 = String::operator_cast_to_char_(&this->_proxyResponse);
          pvStack_40078 = (void *)(uVar4 - (uVar7 - (long)pcVar5));
          if (pvStack_40078 != (void *)0x0) {
            Server::Client::write(this->_client,(int)remainingSize,pvStack_40078,0);
          }
          String::String((String *)&firstLineEnd);
          String::operator=(&this->_proxyResponse,(String *)&firstLineEnd);
          String::~String((String *)&firstLineEnd);
          this->_connected = true;
          pIVar8 = this->_callback;
          (**pIVar8->_vptr_ICallback)();
          tVar3 = Time::time((time_t *)pIVar8);
          this->_lastReadActivity = tVar3;
        }
        else {
          this_01 = &this->_proxyResponse;
          pcVar5 = String::find(this_01,"\r\n");
          pIVar8 = this->_callback;
          pcStack_400a8 = pcVar5;
          pcVar6 = String::operator_cast_to_char_(this_01);
          String::substr(&SStack_400d0,this_01,0,(long)pcVar5 - (long)pcVar6);
          (*pIVar8->_vptr_ICallback[1])(pIVar8,this,&SStack_400d0);
          String::~String(&SStack_400d0);
        }
      }
    }
    else {
      headerEnd = (char *)0x0;
      this_00 = this->_client;
      uVar2 = Server::Client::write(this_00,(int)&size,(void *)postponed,(size_t)&headerEnd);
      if ((uVar2 & 1) != 0) {
        if (headerEnd != (char *)0x0) {
          this_00 = this->_handle;
          Server::Client::suspend(this_00);
        }
        tVar3 = Time::time((time_t *)this_00);
        this->_lastReadActivity = tVar3;
      }
    }
  }
  return;
}

Assistant:

void ProxyLine::onRead()
{
    byte buffer[262144 + 1];
    usize size;
    if (!_handle->read(buffer, sizeof(buffer) - 1, size))
        return;
    if (_connected)
    {
        usize postponed = 0;
        if (!_client.write(buffer, size, &postponed))
            return;
        if (postponed)
            _handle->suspend();
        _lastReadActivity = Time::time();
    }
    else
    {
        buffer[size] = '\0';
        _proxyResponse.append((const char*)buffer, size);
        // expecting "HTTP/1.1 200 Connection established\r\n\r\n"
        const char* headerEnd = _proxyResponse.find("\r\n\r\n");
        if (headerEnd)
        {
            if (_proxyResponse.compare("HTTP/1.1 200 ", 13) == 0)
            {
                const char* bufferPos = headerEnd + 4;
                usize remainingSize = _proxyResponse.length() - (bufferPos - (const char*)_proxyResponse);
                if (remainingSize)
                    _client.write((const byte*)bufferPos, remainingSize);
                _proxyResponse = String();
                _connected = true;
                _callback.onOpened(*this);
                _lastReadActivity = Time::time();
            }
            else
            {
                const char* firstLineEnd = _proxyResponse.find("\r\n");
                _callback.onClosed(*this, _proxyResponse.substr(0, firstLineEnd - (const char*)_proxyResponse));
            }
        }
        else if (_proxyResponse.length() > 256)
            _callback.onClosed(*this, "Invalid HTTP reponse");
    }
}